

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_row_template_push_dynamic(nk_context *ctx)

{
  int iVar1;
  nk_panel *pnVar2;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4c23,"void nk_layout_row_template_push_dynamic(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4c24,"void nk_layout_row_template_push_dynamic(struct nk_context *)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4c25,"void nk_layout_row_template_push_dynamic(struct nk_context *)");
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar2 = ctx->current->layout;
    if ((pnVar2->row).type != NK_LAYOUT_TEMPLATE) {
      __assert_fail("layout->row.type == NK_LAYOUT_TEMPLATE",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x4c2b,"void nk_layout_row_template_push_dynamic(struct nk_context *)");
    }
    if (0xf < (pnVar2->row).columns) {
      __assert_fail("layout->row.columns < 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x4c2c,"void nk_layout_row_template_push_dynamic(struct nk_context *)");
    }
    if (((pnVar2->row).type == NK_LAYOUT_TEMPLATE) && ((pnVar2->row).columns < 0x10)) {
      iVar1 = (pnVar2->row).columns;
      (pnVar2->row).columns = iVar1 + 1;
      (pnVar2->row).templates[iVar1] = -1.0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_layout_row_template_push_dynamic(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    NK_ASSERT(layout->row.type == NK_LAYOUT_TEMPLATE);
    NK_ASSERT(layout->row.columns < NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS);
    if (layout->row.type != NK_LAYOUT_TEMPLATE) return;
    if (layout->row.columns >= NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS) return;
    layout->row.templates[layout->row.columns++] = -1.0f;
}